

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

map_index_t __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
BucketNumber(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,ViewType k)

{
  map_index_t mVar1;
  string *psVar2;
  char *pcVar3;
  VariantKey key;
  map_index_t local_34;
  map_index_t local_30 [4];
  
  local_30[0] = UntypedMapBase::VariantBucketNumber(&this->super_UntypedMapBase,k);
  pcVar3 = "";
  if (k._M_str != (char *)0x0) {
    pcVar3 = k._M_str;
  }
  key.integral = k._M_len;
  key.data = pcVar3;
  local_34 = UntypedMapBase::VariantBucketNumber(&this->super_UntypedMapBase,key);
  psVar2 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_int,unsigned_int>
                     (local_30,&local_34,
                      "VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k)) == VariantBucketNumber(RealKeyToVariantKey<Key>{}(k))"
                     );
  if (psVar2 == (string *)0x0) {
    mVar1 = UntypedMapBase::VariantBucketNumber(&this->super_UntypedMapBase,k);
    return mVar1;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/map.h"
             ,0x467,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_30);
}

Assistant:

map_index_t BucketNumber(typename TS::ViewType k) const {
    ABSL_DCHECK_EQ(
        VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k)),
        VariantBucketNumber(RealKeyToVariantKey<Key>{}(k)));
    return VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k));
  }